

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

void __thiscall
pbrt::BVHAggregate::BVHAggregate
          (BVHAggregate *this,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *p,
          int maxPrimsInNode,SplitMethod splitMethod)

{
  long *plVar1;
  undefined8 uVar2;
  pointer pPVar3;
  pointer pPVar4;
  atomic<int> aVar5;
  int iVar6;
  BVHBuildNode *node;
  LinearBVHNode *pLVar7;
  LinearBVHNode *pLVar8;
  pointer pPVar9;
  long lVar10;
  ulong uVar11;
  size_type __n;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 in_XMM4 [16];
  atomic<int> totalNodes;
  __int_type_conflict va;
  atomic<int> orderedPrimsOffset;
  int offset;
  float fStack_100;
  float fStack_fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_e8;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> bvhPrimitives;
  vector<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  threadAllocators;
  float local_94;
  vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
  threadResources;
  monotonic_buffer_resource resource;
  
  iVar6 = 0xff;
  if (maxPrimsInNode < 0xff) {
    iVar6 = maxPrimsInNode;
  }
  this->maxPrimsInNode = iVar6;
  pPVar9 = (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar9;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (p->super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  this->splitMethod = splitMethod;
  this->nodes = (LinearBVHNode *)0x0;
  pPVar9 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar3 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pPVar9 == pPVar3) {
    LogFatal<char_const(&)[20]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
               ,0x92,"Check failed: %s",(char (*) [20])"!primitives.empty()");
  }
  std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::vector
            (&bvhPrimitives,(long)pPVar3 - (long)pPVar9 >> 3,(allocator_type *)&resource);
  pPVar9 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->primitives).
      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar9) {
    lVar12 = 5;
    lVar10 = 0;
    uVar11 = 0;
    do {
      PrimitiveHandle::Bounds
                ((Bounds3f *)&offset,
                 (PrimitiveHandle *)
                 ((long)&(pPVar9->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits + lVar10));
      resource.super_memory_resource._vptr_memory_resource = (_func_int **)_offset;
      auVar13._0_4_ = SUB84(_offset,0) * 0.5 + fStack_fc * 0.5;
      auVar13._4_4_ =
           (float)((ulong)_offset >> 0x20) * 0.5 + (float)local_f8._M_allocated_capacity._0_4_ * 0.5
      ;
      auVar13._8_8_ = 0;
      *(ulong *)((long)bvhPrimitives.
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar12 * 8 + -0x28) = uVar11;
      plVar1 = (long *)((long)bvhPrimitives.
                              super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar12 * 8 + -0x20);
      *plVar1 = (long)_offset;
      plVar1[1] = CONCAT44(fStack_fc,fStack_100);
      *(ulong *)((long)bvhPrimitives.
                       super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar12 * 8 + -0x10) =
           CONCAT44(local_f8._M_allocated_capacity._4_4_,local_f8._M_allocated_capacity._0_4_);
      uVar2 = vmovlps_avx(auVar13);
      *(undefined8 *)
       ((long)bvhPrimitives.
              super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12 * 8 + -8) = uVar2;
      *(float *)(&(bvhPrimitives.
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                   _M_impl.super__Vector_impl_data._M_start)->primitiveIndex + lVar12) =
           fStack_100 * 0.5 + (float)local_f8._M_allocated_capacity._4_4_ * 0.5;
      uVar11 = uVar11 + 1;
      pPVar9 = (this->primitives).
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 8;
      lVar12 = lVar12 + 6;
    } while (uVar11 < (ulong)((long)(this->primitives).
                                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 3))
    ;
  }
  resource.upstreamResource = pstd::pmr::get_default_resource();
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.usedBlocks;
  resource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_02f019a0;
  resource.blockSize = 0x40000;
  resource.currentBlock.ptr = (void *)0x0;
  resource.currentBlock.size = 0;
  resource.currentBlockPos = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.usedBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar6 = MaxThreadIndex();
  __n = (size_type)iVar6;
  std::
  vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
  ::vector(&threadResources,__n,(allocator_type *)&offset);
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  threadAllocators.
  super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar6 != 0) {
    lVar10 = 0;
    do {
      _offset = (pointer)((long)&((threadResources.
                                   super__Vector_base<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_memory_resource
                                 )._vptr_memory_resource + lVar10);
      std::
      vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>
      ::emplace_back<pstd::pmr::polymorphic_allocator<std::byte>>
                ((vector<pstd::pmr::polymorphic_allocator<std::byte>,std::allocator<pstd::pmr::polymorphic_allocator<std::byte>>>
                  *)&threadAllocators,(polymorphic_allocator<std::byte> *)&offset);
      lVar10 = lVar10 + 0x48;
      __n = __n - 1;
    } while (__n != 0);
  }
  totalNodes.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::vector
            (&local_e8,
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&offset);
  if (splitMethod == HLBVH) {
    node = buildHLBVH(this,&resource.super_memory_resource,&bvhPrimitives,&totalNodes,&local_e8);
  }
  else {
    orderedPrimsOffset.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    node = buildRecursive(this,&threadAllocators,&bvhPrimitives,0,
                          (int)((ulong)((long)(this->primitives).
                                              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->primitives).
                                             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          &totalNodes,&orderedPrimsOffset,&local_e8);
    va = (__int_type_conflict)orderedPrimsOffset.super___atomic_base<int>._M_i;
    _offset = (pointer)((long)local_e8.
                              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_offset !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(long)(int)orderedPrimsOffset.super___atomic_base<int>._M_i) {
      LogFatal<char_const(&)[26],char_const(&)[20],char_const(&)[26],int&,char_const(&)[20],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
                 ,0xac,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [26])"orderedPrimsOffset.load()",(char (*) [20])"orderedPrims.size()",
                 (char (*) [26])"orderedPrimsOffset.load()",&va,(char (*) [20])"orderedPrims.size()"
                 ,(unsigned_long *)&offset);
    }
  }
  pPVar9 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar3 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar4 = (this->primitives).
           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_start = pPVar3;
  local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_finish = pPVar4;
  local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = pPVar9;
  std::vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>::resize(&bvhPrimitives,0);
  if (LOGGING_LogLevel < 1) {
    orderedPrimsOffset = totalNodes;
    va = (__int_type_conflict)
         ((ulong)((long)(this->primitives).
                        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->primitives).
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
    auVar13 = vcvtusi2ss_avx512f(in_XMM4,(long)(int)totalNodes.super___atomic_base<int>._M_i << 5);
    local_94 = auVar13._0_4_ * 9.536743e-07;
    fStack_100 = 0.0;
    fStack_fc = 0.0;
    local_f8._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_ & 0xffffff00;
    _offset = (pointer)&local_f8;
    detail::stringPrintfRecursive<int,int,float>
              ((string *)&offset,"BVH created with %d nodes for %d primitives (%.2f MB)",
               (int *)&orderedPrimsOffset,&va,&local_94);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
        ,0xb2,_offset);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_offset != &local_f8) {
      operator_delete(_offset,CONCAT44(local_f8._M_allocated_capacity._4_4_,
                                       local_f8._M_allocated_capacity._0_4_) + 1);
    }
  }
  aVar5.super___atomic_base<int>._M_i = totalNodes.super___atomic_base<int>._M_i;
  *(long *)(in_FS_OFFSET + -0x330) =
       (long)(this->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish +
       *(long *)(in_FS_OFFSET + -0x330) +
       ((long)(int)totalNodes.super___atomic_base<int>._M_i * 0x20 -
       (long)(this->primitives).
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start) + 0x30;
  lVar10 = (long)(int)totalNodes.super___atomic_base<int>._M_i;
  uVar11 = 0xffffffffffffffff;
  if (-1 < (int)totalNodes.super___atomic_base<int>._M_i) {
    uVar11 = lVar10 * 0x20;
  }
  pLVar7 = (LinearBVHNode *)operator_new__(uVar11,0x20);
  if (aVar5.super___atomic_base<int>._M_i != 0) {
    auVar14._8_4_ = 0xff7fffff;
    auVar14._0_8_ = &DAT_ff7fffffff7fffff;
    auVar14._12_4_ = 0xff7fffff;
    pLVar8 = pLVar7;
    do {
      (pLVar8->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
      (pLVar8->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
      *(undefined8 *)&(pLVar8->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0xff7fffff7f7fffff
      ;
      uVar2 = vmovlps_avx(auVar14);
      (pLVar8->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar2;
      (pLVar8->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)((ulong)uVar2 >> 0x20)
      ;
      pLVar8 = pLVar8 + 1;
    } while (pLVar8 != pLVar7 + lVar10);
  }
  this->nodes = pLVar7;
  _offset = _offset & 0xffffffff00000000;
  flattenBVHTree(this,node,&offset);
  orderedPrimsOffset = totalNodes;
  va = offset;
  if (totalNodes.super___atomic_base<int>._M_i == (__atomic_base<int>)offset) {
    if (local_e8.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (threadAllocators.
        super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(threadAllocators.
                      super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)threadAllocators.
                            super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)threadAllocators.
                            super__Vector_base<pstd::pmr::polymorphic_allocator<std::byte>,_std::allocator<pstd::pmr::polymorphic_allocator<std::byte>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<pstd::pmr::monotonic_buffer_resource,_std::allocator<pstd::pmr::monotonic_buffer_resource>_>
    ::~vector(&threadResources);
    pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&resource);
    if (bvhPrimitives.super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(bvhPrimitives.
                      super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)bvhPrimitives.
                            super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)bvhPrimitives.
                            super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  LogFatal<char_const(&)[18],char_const(&)[7],char_const(&)[18],int&,char_const(&)[7],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/aggregates.cpp"
             ,0xba,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [18])"totalNodes.load()"
             ,(char (*) [7])0xa385b6,(char (*) [18])"totalNodes.load()",(int *)&orderedPrimsOffset,
             (char (*) [7])0xa385b6,&va);
}

Assistant:

BVHAggregate::BVHAggregate(std::vector<PrimitiveHandle> p, int maxPrimsInNode,
                           SplitMethod splitMethod)
    : maxPrimsInNode(std::min(255, maxPrimsInNode)),
      primitives(std::move(p)),
      splitMethod(splitMethod) {
    CHECK(!primitives.empty());
    // Build BVH from _primitives_
    // Initialize _bvhPrimitives_ array for primitives
    std::vector<BVHPrimitive> bvhPrimitives(primitives.size());
    for (size_t i = 0; i < primitives.size(); ++i)
        bvhPrimitives[i] = BVHPrimitive(i, primitives[i].Bounds());

    // Build BVH for primitives using _bvhPrimitives_
    // Declare _Allocator_s used for BVH construction
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator alloc(&resource);
    int nThreads = MaxThreadIndex();
    std::vector<pstd::pmr::monotonic_buffer_resource> threadResources(nThreads);
    std::vector<Allocator> threadAllocators;
    for (size_t i = 0; i < nThreads; ++i)
        threadAllocators.push_back(Allocator(&threadResources[i]));

    std::atomic<int> totalNodes{0};
    std::vector<PrimitiveHandle> orderedPrims(primitives.size());
    BVHBuildNode *root;
    if (splitMethod == SplitMethod::HLBVH) {
        root = buildHLBVH(alloc, bvhPrimitives, &totalNodes, orderedPrims);
    } else {
        std::atomic<int> orderedPrimsOffset{0};
        root = buildRecursive(threadAllocators, bvhPrimitives, 0, primitives.size(),
                              &totalNodes, &orderedPrimsOffset, orderedPrims);
        CHECK_EQ(orderedPrimsOffset.load(), orderedPrims.size());
    }
    primitives.swap(orderedPrims);
    bvhPrimitives.resize(0);
    LOG_VERBOSE("BVH created with %d nodes for %d primitives (%.2f MB)",
                totalNodes.load(), (int)primitives.size(),
                float(totalNodes.load() * sizeof(LinearBVHNode)) / (1024.f * 1024.f));

    // Flatten BVH into _nodes_ array
    treeBytes += totalNodes * sizeof(LinearBVHNode) + sizeof(*this) +
                 primitives.size() * sizeof(primitives[0]);
    nodes = new LinearBVHNode[totalNodes];
    int offset = 0;
    flattenBVHTree(root, &offset);
    CHECK_EQ(totalNodes.load(), offset);
}